

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_compareUnitsCompatibleComplex_Test::TestBody(Units_compareUnitsCompatibleComplex_Test *this)

{
  string *psVar1;
  string sVar2;
  char cVar3;
  ModelPtr model;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  UnitsPtr u;
  AssertionResult local_c0;
  long local_b0 [2];
  long *local_a0;
  AssertHelper local_98 [8];
  string *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  long local_80 [2];
  long *local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  long local_60 [2];
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Units::create();
  psVar1 = local_30;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"u","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"micro","");
  local_90 = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  libcellml::Units::addUnit((StandardUnit)local_30,(string *)0x2,2.0,3.0,(string *)&local_c0);
  if (local_90 != (string *)local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_40;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  psVar1 = local_40;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"metre","");
  local_90 = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"milli","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  libcellml::Units::addUnit(psVar1,(string *)&local_c0,2.0,1.0,(string *)&local_90);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_90 != (string *)local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  psVar1 = local_40;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"milli","");
  local_90 = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>();
  libcellml::Units::addUnit((StandardUnit)psVar1,(string *)0x0,1.0,1.0,(string *)&local_c0);
  if (local_90 != (string *)local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"u","");
  libcellml::Units::addUnit(local_40);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_50;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  psVar1 = local_50;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>();
  libcellml::Units::addUnit((StandardUnit)psVar1,0,1.0,3.0,(string *)0x0);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  psVar1 = local_50;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"u","");
  libcellml::Units::addUnit(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"metre","");
  local_90 = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"milli","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  libcellml::Units::addUnit(local_50,(string *)&local_c0,2.0,1.0,(string *)&local_90);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_90 != (string *)local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Model::create();
  psVar1 = local_90;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Model::addUnits((shared_ptr *)local_90);
  libcellml::Model::addUnits((shared_ptr *)local_90);
  libcellml::Model::addUnits((shared_ptr *)local_90);
  sVar2 = (string)libcellml::Units::compatible((shared_ptr *)&local_40,(shared_ptr *)&local_50);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70._0_1_ = sVar2;
  if (sVar2 == (string)0x0) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(char *)&local_70,"libcellml::Units::compatible(u1, u2)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x6c5,(char *)local_c0._0_8_);
    testing::internal::AssertHelper::operator=(local_98,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    if ((long *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
    }
    if (local_a0 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_a0 != (long *)0x0)) {
        (**(code **)(*local_a0 + 8))();
      }
      local_a0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar3 = libcellml::Units::compatible((shared_ptr *)&local_50,(shared_ptr *)&local_40);
  local_70 = (long *)CONCAT71(local_70._1_7_,cVar3);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(char *)&local_70,"libcellml::Units::compatible(u2, u1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x6c6,(char *)local_c0._0_8_);
    testing::internal::AssertHelper::operator=(local_98,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    if ((long *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
    }
    if (local_a0 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_a0 != (long *)0x0)) {
        (**(code **)(*local_a0 + 8))();
      }
      local_a0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Units, compareUnitsCompatibleComplex)
{
    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit(libcellml::Units::StandardUnit::CANDELA, "micro", 2.0, 3.0);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("metre", "milli", 2.0, 1.0);
    u1->addUnit(libcellml::Units::StandardUnit::AMPERE, "milli", 1.0, 1.0);
    u1->addUnit("u");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::AMPERE, 0, 1.0, 3.0);
    u2->addUnit("u");
    u2->addUnit("metre", "milli", 2.0, 1.0); // Only unit attributes which matter now are the exponent and the base unit. Not interested in multipliers.

    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");
    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_TRUE(libcellml::Units::compatible(u1, u2));
    EXPECT_TRUE(libcellml::Units::compatible(u2, u1));
}